

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_Call_single(UA_Server *server,UA_Session *session,UA_CallMethodRequest *request,
                        UA_CallMethodResult *result)

{
  UA_NodeStore *ns;
  UA_ReferenceNode *pUVar1;
  ulong uVar2;
  ulong uVar3;
  UA_Boolean UVar4;
  UA_StatusCode UVar5;
  UA_MethodNode *ofMethod;
  UA_Node *n2;
  UA_VariableNode *pUVar6;
  UA_Variant *pUVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  undefined8 *puVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  UA_String UVar15;
  undefined1 local_88 [8];
  UA_NodeId hasComponentNodeId;
  UA_NodeId hasSubTypeNodeId;
  
  ns = server->nodestore;
  ofMethod = (UA_MethodNode *)UA_NodeStore_get(ns,&request->methodId);
  if (ofMethod == (UA_MethodNode *)0x0) {
    result->statusCode = 0x80750000;
    return;
  }
  if (ofMethod->nodeClass == UA_NODECLASS_METHOD) {
    if (((ofMethod->executable != true) || (ofMethod->userExecutable != true)) ||
       (ofMethod->attachedMethod == (UA_MethodCallback)0x0)) {
      result->statusCode = 0x803b0000;
      return;
    }
    n2 = UA_NodeStore_get(ns,&request->objectId);
    if (n2 == (UA_Node *)0x0) {
      result->statusCode = 0x80330000;
      return;
    }
    if ((n2->nodeClass == UA_NODECLASS_OBJECT) || (n2->nodeClass == UA_NODECLASS_OBJECTTYPE)) {
      local_88._0_2_ = 0;
      stack0xffffffffffffff7c = 0x2f00000000;
      hasComponentNodeId.identifier._8_2_ = 0;
      stack0xffffffffffffff94 = 0x2d00000000;
      sVar9 = ofMethod->referencesSize;
      lVar13 = 0x20;
      while( true ) {
        bVar14 = sVar9 == 0;
        sVar9 = sVar9 - 1;
        if (bVar14) {
          result->statusCode = 0x80750000;
          return;
        }
        pUVar1 = ofMethod->references;
        if (((*(char *)((long)pUVar1 + lVar13 + -8) == '\x01') &&
            (UVar4 = UA_NodeId_equal((UA_NodeId *)
                                     ((long)&(pUVar1->referenceTypeId).namespaceIndex + lVar13),
                                     &n2->nodeId), UVar4)) &&
           (UVar4 = isNodeInTree(ns,(UA_NodeId *)((long)pUVar1 + lVar13 + -0x20),
                                 (UA_NodeId *)local_88,
                                 (UA_NodeId *)((long)&hasComponentNodeId.identifier + 8),1), UVar4))
        break;
        lVar13 = lVar13 + 0x50;
      }
      UVar15 = UA_STRING("InputArguments");
      pUVar6 = getArgumentsVariableNode(server,ofMethod,UVar15);
      uVar10 = request->inputArgumentsSize;
      if (pUVar6 != (UA_VariableNode *)0x0) {
        UVar5 = 0x80020000;
        if (((pUVar6->value).dataSource.read ==
             (_func_UA_StatusCode_void_ptr_UA_NodeId_UA_Boolean_UA_NumericRange_ptr_UA_DataValue_ptr
              *)0x13be40) && (pUVar6->valueSource == UA_VALUESOURCE_DATA)) {
          uVar2 = *(ulong *)((long)&pUVar6->value + 0x20);
          uVar3 = *(ulong *)((long)&pUVar6->value + 0x18);
          uVar8 = (ulong)(1 < uVar2);
          if (uVar3 != 0) {
            uVar8 = uVar3;
          }
          UVar5 = 0x80760000;
          if ((uVar8 <= uVar10) && (UVar5 = 0x80ab0000, uVar8 == uVar10)) {
            pUVar7 = request->inputArguments;
            puVar11 = (undefined8 *)(uVar2 + 0x38);
            uVar12 = 0;
            while (bVar14 = uVar10 != 0, uVar10 = uVar10 - 1, bVar14) {
              UVar5 = typeCheckValue(server,(UA_NodeId *)(puVar11 + -5),*(UA_Int32 *)(puVar11 + -2),
                                     puVar11[-1],(UA_UInt32 *)*puVar11,pUVar7,(UA_NumericRange *)0x0
                                     ,pUVar7);
              uVar12 = uVar12 | UVar5;
              pUVar7 = pUVar7 + 1;
              puVar11 = puVar11 + 0xc;
            }
            result->statusCode = uVar12;
            if (uVar12 != 0) {
              return;
            }
            goto LAB_0012054f;
          }
        }
        result->statusCode = UVar5;
        return;
      }
      if (uVar10 != 0) {
        result->statusCode = 0x80ab0000;
        return;
      }
LAB_0012054f:
      result->outputArgumentsSize = 0;
      UVar15 = UA_STRING("OutputArguments");
      pUVar6 = getArgumentsVariableNode(server,ofMethod,UVar15);
      if (pUVar6 == (UA_VariableNode *)0x0) {
        pUVar7 = result->outputArguments;
        sVar9 = 0;
      }
      else {
        pUVar7 = (UA_Variant *)
                 UA_Array_new(*(size_t *)((long)&pUVar6->value + 0x18),UA_TYPES + 0x17);
        result->outputArguments = pUVar7;
        if (pUVar7 == (UA_Variant *)0x0) {
          result->statusCode = 0x80030000;
          return;
        }
        sVar9 = *(size_t *)((long)&pUVar6->value + 0x18);
        result->outputArgumentsSize = sVar9;
      }
      methodCallSession = session;
      UVar5 = (*ofMethod->attachedMethod)
                        (ofMethod->methodHandle,n2->nodeId,request->inputArgumentsSize,
                         request->inputArguments,sVar9,pUVar7);
      result->statusCode = UVar5;
      methodCallSession = (UA_Session *)0x0;
      return;
    }
  }
  result->statusCode = 0x805f0000;
  return;
}

Assistant:

void
Service_Call_single(UA_Server *server, UA_Session *session,
                    const UA_CallMethodRequest *request,
                    UA_CallMethodResult *result) {
    /* Get/verify the method node */
    const UA_MethodNode *methodCalled =
        (const UA_MethodNode*)UA_NodeStore_get(server->nodestore, &request->methodId);
    if(!methodCalled) {
        result->statusCode = UA_STATUSCODE_BADMETHODINVALID;
        return;
    }
    if(methodCalled->nodeClass != UA_NODECLASS_METHOD) {
        result->statusCode = UA_STATUSCODE_BADNODECLASSINVALID;
        return;
    }
    if(!methodCalled->executable || !methodCalled->userExecutable || !methodCalled->attachedMethod) {
        result->statusCode = UA_STATUSCODE_BADNOTWRITABLE; // There is no NOTEXECUTABLE?
        return;
    }

    /* Get/verify the object node */
    const UA_ObjectNode *withObject =
        (const UA_ObjectNode*)UA_NodeStore_get(server->nodestore, &request->objectId);
    if(!withObject) {
        result->statusCode = UA_STATUSCODE_BADNODEIDINVALID;
        return;
    }
    if(withObject->nodeClass != UA_NODECLASS_OBJECT && withObject->nodeClass != UA_NODECLASS_OBJECTTYPE) {
        result->statusCode = UA_STATUSCODE_BADNODECLASSINVALID;
        return;
    }

    /* Verify method/object relations. Object must have a hasComponent or a
     * subtype of hasComponent reference to the method node. Therefore, check
     * every reference between the parent object and the method node if there is
     * a hasComponent (or subtype) reference */
    UA_Boolean found = false;
    UA_NodeId hasComponentNodeId = UA_NODEID_NUMERIC(0,UA_NS0ID_HASCOMPONENT);
    UA_NodeId hasSubTypeNodeId = UA_NODEID_NUMERIC(0,UA_NS0ID_HASSUBTYPE);
    for(size_t i = 0; i < methodCalled->referencesSize; ++i) {
        if(methodCalled->references[i].isInverse &&
           UA_NodeId_equal(&methodCalled->references[i].targetId.nodeId, &withObject->nodeId)) {
            found = isNodeInTree(server->nodestore, &methodCalled->references[i].referenceTypeId,
                                 &hasComponentNodeId, &hasSubTypeNodeId, 1);
            if(found)
                break;
        }
    }
    if(!found) {
        result->statusCode = UA_STATUSCODE_BADMETHODINVALID;
        return;
    }

    /* Verify Input Argument count, types and sizes */
    const UA_VariableNode *inputArguments =
        getArgumentsVariableNode(server, methodCalled, UA_STRING("InputArguments"));

    if(!inputArguments) {
        if(request->inputArgumentsSize > 0) {
            result->statusCode = UA_STATUSCODE_BADINVALIDARGUMENT;
            return;
        }
    } else {
        result->statusCode = argumentsConformsToDefinition(server, inputArguments,
                                                           request->inputArgumentsSize,
                                                           request->inputArguments);
        if(result->statusCode != UA_STATUSCODE_GOOD)
            return;
    }

    /* Allocate the output arguments */
    result->outputArgumentsSize = 0; /* the default */
    const UA_VariableNode *outputArguments =
        getArgumentsVariableNode(server, methodCalled, UA_STRING("OutputArguments"));
    if(outputArguments) {
        result->outputArguments = UA_Array_new(outputArguments->value.data.value.value.arrayLength,
                                               &UA_TYPES[UA_TYPES_VARIANT]);
        if(!result->outputArguments) {
            result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
            return;
        }
        result->outputArgumentsSize = outputArguments->value.data.value.value.arrayLength;
    }

    /* Call the method */
#if defined(UA_ENABLE_METHODCALLS) && defined(UA_ENABLE_SUBSCRIPTIONS)
    methodCallSession = session;
#endif
    result->statusCode = methodCalled->attachedMethod(methodCalled->methodHandle, withObject->nodeId,
                                                      request->inputArgumentsSize, request->inputArguments,
                                                      result->outputArgumentsSize, result->outputArguments);
#if defined(UA_ENABLE_METHODCALLS) && defined(UA_ENABLE_SUBSCRIPTIONS)
    methodCallSession = NULL;
#endif

    /* TODO: Verify Output matches the argument definition */
}